

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_assertion_handler.hpp
# Opt level: O2

void __thiscall
Catch::AssertionHandler::handleExpr<slang::syntax::MemberSyntax*&>
          (AssertionHandler *this,ExprLhs<slang::syntax::MemberSyntax_*&> *expr)

{
  ITransientExpression local_18;
  MemberSyntax **local_8;
  
  local_8 = expr->m_lhs;
  local_18.m_result = *local_8 != (MemberSyntax *)0x0;
  local_18.m_isBinaryExpression = false;
  local_18._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b65d08;
  handleExpr(this,&local_18);
  return;
}

Assistant:

constexpr void handleExpr( ExprLhs<T> const& expr ) {
            handleExpr( expr.makeUnaryExpr() );
        }